

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void assert_solvers_return_equal_cost<int>
               (matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                *cost_matrix)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  int total_cost_brute_force;
  int total_cost;
  string local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment_brute_force;
  string local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  string local_68;
  char *local_48;
  char *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char *local_28;
  char *local_20;
  
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = hungarian_algorithm::
          solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    (cost_matrix,cost_matrix->size1_,cost_matrix->size2_,&assignment);
  total_cost = iVar1;
  iVar2 = hungarian_algorithm::
          solveBruteForce<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    (cost_matrix,cost_matrix->size1_,cost_matrix->size2_,&assignment_brute_force);
  total_cost_brute_force = iVar2;
  if (iVar1 != iVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"total_cost != total_cost_brute_force:");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"  total_cost: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"  total_cost_brute_force: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"  cost_matrix: [");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
    std::__cxx11::string::string((string *)&local_e8,"    ",&local_f1);
    std::__cxx11::string::string((string *)&local_a8,", ",&local_f2);
    std::__cxx11::string::string((string *)&local_68,";\n",&local_f3);
    print_matrix<int>((ostream *)&std::cerr,cost_matrix,&local_e8,&local_a8,&local_68);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    poVar3 = std::operator<<((ostream *)&std::cerr,"  ]");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Hungarian assignment:");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::string((string *)&local_e8,"    ",(allocator *)&local_a8);
    print_assignment<int>((ostream *)&std::cerr,&assignment,cost_matrix,&local_e8);
    std::__cxx11::string::_M_dispose();
    poVar3 = std::operator<<((ostream *)&std::cerr,"  brute force assignment:");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::string((string *)&local_e8,"    ",(allocator *)&local_a8);
    print_assignment<int>((ostream *)&std::cerr,&assignment_brute_force,cost_matrix,&local_e8);
    std::__cxx11::string::_M_dispose();
  }
  local_28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_20 = "";
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_28,0xcd);
  local_e8._M_string_length._0_1_ = 0;
  local_e8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00124b80;
  local_e8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_e8.field_2._8_8_ = (long)"\x03" + 1;
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_40 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_e8,&local_48,0xcd,1,2,&total_cost,"total_cost",&total_cost_brute_force,
             "total_cost_brute_force");
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&assignment_brute_force.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void assert_solvers_return_equal_cost(const ublas::matrix<Cost>& cost_matrix)
{
  std::vector<std::size_t> assignment, assignment_brute_force;
  const Cost total_cost = hungarian_algorithm::solve<Cost>(
    cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment);
  const Cost total_cost_brute_force = hungarian_algorithm::solveBruteForce<Cost>(
    cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment_brute_force);
  if (total_cost != total_cost_brute_force)
  {
    std::cerr << "total_cost != total_cost_brute_force:" << std::endl;
    std::cerr << "  total_cost: " << total_cost << std::endl;
    std::cerr << "  total_cost_brute_force: " << total_cost_brute_force << std::endl;
    std::cerr << "  cost_matrix: [" << std::endl << std::setw(3);
    print_matrix(std::cerr, cost_matrix, "    ");
    std::cerr << "  ]" << std::endl;
    std::cerr << "  Hungarian assignment:" << std::endl;
    print_assignment(std::cerr, assignment, cost_matrix, "    ");
    std::cerr << "  brute force assignment:" << std::endl;
    print_assignment(std::cerr, assignment_brute_force, cost_matrix, "    ");
  }
  BOOST_CHECK_EQUAL(total_cost, total_cost_brute_force);
}